

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ShuffleTests(UnitTestImpl *this)

{
  Random *random;
  pointer ppTVar1;
  TestSuite **test_suite;
  pointer ppTVar2;
  
  random = &this->random_;
  ShuffleRange<int>(random,0,this->last_death_test_suite_ + 1,&this->test_suite_indices_);
  ShuffleRange<int>(random,this->last_death_test_suite_ + 1,
                    (int)((ulong)((long)(this->test_suites_).
                                        super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->test_suites_).
                                       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3),
                    &this->test_suite_indices_);
  ppTVar1 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar2 = (this->test_suites_).
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar2 != ppTVar1; ppTVar2 = ppTVar2 + 1
      ) {
    Shuffle<int>(random,&(*ppTVar2)->test_indices_);
  }
  return;
}

Assistant:

void UnitTestImpl::ShuffleTests() {
  // Shuffles the death test suites.
  ShuffleRange(random(), 0, last_death_test_suite_ + 1, &test_suite_indices_);

  // Shuffles the non-death test suites.
  ShuffleRange(random(), last_death_test_suite_ + 1,
               static_cast<int>(test_suites_.size()), &test_suite_indices_);

  // Shuffles the tests inside each test suite.
  for (auto& test_suite : test_suites_) {
    test_suite->ShuffleTests(random());
  }
}